

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::directoryChanged
          (QFileSystemModelPrivate *this,QString *directory,QStringList *files)

{
  Data *pDVar1;
  bool bVar2;
  QFileSystemNode *parentNode;
  iterator iVar3;
  iterator iVar4;
  pointer pQVar5;
  long lVar6;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  piter local_80;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parentNode = node(this,directory,false);
  pDVar1 = (parentNode->children).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_70.d = (files->d).d;
    local_70.ptr = (files->d).ptr;
    local_70.size = (files->d).size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar3 = QList<QString>::begin((QList<QString> *)&local_70);
    iVar4 = QList<QString>::end((QList<QString> *)&local_70);
    std::__sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar3.i,iVar4.i);
    local_80 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constBegin
                                (&parentNode->children);
    while ((local_80.d !=
            (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)0x0 ||
           (local_80.bucket != 0))) {
      iVar3 = QList<QString>::begin((QList<QString> *)&local_70);
      iVar4 = QList<QString>::end((QList<QString> *)&local_70);
      iVar3 = std::__lower_bound<QList<QString>::iterator,QString,__gnu_cxx::__ops::_Iter_less_val>
                        (iVar3.i,iVar4.i,
                         *(undefined8 *)
                          ((local_80.d)->spans[local_80.bucket >> 7].entries
                           [(local_80.d)->spans[local_80.bucket >> 7].offsets
                            [(uint)local_80.bucket & 0x7f]].storage.data + 0x18));
      iVar4 = QList<QString>::end((QList<QString> *)&local_70);
      if (iVar3.i == iVar4.i) {
LAB_005719ab:
        QList<QString>::emplaceBack<QString_const&>
                  ((QList<QString> *)&local_58,
                   *(QString **)
                    ((local_80.d)->spans[local_80.bucket >> 7].entries
                     [(local_80.d)->spans[local_80.bucket >> 7].offsets
                      [(uint)local_80.bucket & 0x7f]].storage.data + 0x18));
      }
      else {
        bVar2 = ::operator<(*(QString **)
                             ((local_80.d)->spans[local_80.bucket >> 7].entries
                              [(local_80.d)->spans[local_80.bucket >> 7].offsets
                               [(uint)local_80.bucket & 0x7f]].storage.data + 0x18),iVar3.i);
        if (bVar2) goto LAB_005719ab;
      }
      QHashPrivate::
      iterator<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_>::operator++
                (&local_80);
    }
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < (ulong)local_58.size; uVar7 = uVar7 + 1) {
      pQVar5 = QList<QString>::data((QList<QString> *)&local_58);
      removeNode(this,parentNode,(QString *)((long)&(pQVar5->d).d + lVar6));
      lVar6 = lVar6 + 0x18;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::directoryChanged(const QString &directory, const QStringList &files)
{
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(directory, false);
    if (parentNode->children.size() == 0)
        return;
    QStringList toRemove;
    QStringList newFiles = files;
    std::sort(newFiles.begin(), newFiles.end());
    for (auto i = parentNode->children.constBegin(), cend = parentNode->children.constEnd(); i != cend; ++i) {
        QStringList::iterator iterator = std::lower_bound(newFiles.begin(), newFiles.end(), i.value()->fileName);
        if ((iterator == newFiles.end()) || (i.value()->fileName < *iterator))
            toRemove.append(i.value()->fileName);
    }
    for (int i = 0 ; i < toRemove.size() ; ++i )
        removeNode(parentNode, toRemove[i]);
}